

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_callerinfo(CallerInfo *callerinfo,char *fn)

{
  int iVar1;
  void *ptr_00;
  char *local_40;
  char *str;
  void *ptr;
  int framei;
  int frames;
  int i;
  char *fn_local;
  CallerInfo *callerinfo_local;
  
  if (dump_callers != 0) {
    iVar1 = callerinfo->num_callstack_frames;
    for (framei = 0; (uint)framei < callerinfo->trace_scope; framei = framei + 1) {
      printf("    ");
    }
    printf("Call from threadid = %u, stack = {\n",(ulong)callerinfo->threadid);
    for (ptr._4_4_ = 0; ptr._4_4_ < iVar1; ptr._4_4_ = ptr._4_4_ + 1) {
      ptr_00 = callerinfo->callstack[ptr._4_4_].frame;
      local_40 = callerinfo->callstack[ptr._4_4_].sym;
      for (framei = 0; (uint)framei < callerinfo->trace_scope; framei = framei + 1) {
        printf("    ");
      }
      if (local_40 == (char *)0x0) {
        local_40 = ptrString(ptr_00);
      }
      printf("    %s\n",local_40);
    }
    for (framei = 0; (uint)framei < callerinfo->trace_scope; framei = framei + 1) {
      printf("    ");
    }
    printf("}\n");
  }
  if (dump_calls != 0) {
    for (framei = 0; (uint)framei < callerinfo->trace_scope; framei = framei + 1) {
      printf("    ");
    }
    printf("%s",fn);
  }
  return;
}

Assistant:

static void dump_callerinfo(const CallerInfo *callerinfo, const char *fn)
{
    int i;

    if (dump_callers) {
        const int frames = callerinfo->num_callstack_frames;
        int framei;
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }

        printf("Call from threadid = %u, stack = {\n", (uint) callerinfo->threadid);

        for (framei = 0; framei < frames; framei++) {
            void *ptr = callerinfo->callstack[framei].frame;
            const char *str = callerinfo->callstack[framei].sym;
            for (i = 0; i < callerinfo->trace_scope; i++) {
                printf("    ");
            }
            printf("    %s\n", str ? str : ptrString(ptr));
        }

        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("}\n");
    }

    if (dump_calls) {
        for (i = 0; i < callerinfo->trace_scope; i++) {
            printf("    ");
        }
        printf("%s", fn);
    }
}